

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

PtrTokenOrSyntax * __thiscall
slang::syntax::HierarchicalInstanceSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,HierarchicalInstanceSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (HierarchicalInstanceSyntax *)0x0:
    p_Var1 = *(__index_type **)
              ((long)&__return_storage_ptr__[1].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
    break;
  case (HierarchicalInstanceSyntax *)0x1:
    return __return_storage_ptr__ + 2;
  case (HierarchicalInstanceSyntax *)0x2:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[3].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (HierarchicalInstanceSyntax *)0x3:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&__return_storage_ptr__[6].
                   super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
           + 8);
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax HierarchicalInstanceSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return decl;
        case 1: return &openParen;
        case 2: return &connections;
        case 3: return &closeParen;
        default: return nullptr;
    }
}